

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall
stringToUnits_outOfRangeNumbers_Test::TestBody(stringToUnits_outOfRangeNumbers_Test *this)

{
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  char *pcVar4;
  char *in_R9;
  double dVar5;
  precise_unit pVar6;
  string local_118;
  AssertHelper local_f8;
  Message local_f0;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__1;
  string local_c8;
  unit local_a8;
  unit ucs;
  AssertHelper local_80;
  Message local_78;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  allocator local_41;
  string local_40;
  double local_20;
  precise_unit u1;
  stringToUnits_outOfRangeNumbers_Test *this_local;
  
  u1._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"2.76e309m",&local_41);
  uVar3 = units::getDefaultFlags();
  pVar6 = units::unit_from_string(&local_40,uVar3);
  u1.multiplier_ = pVar6._8_8_;
  local_20 = pVar6.multiplier_;
  std::__cxx11::string::~string((string *)&local_40);
  dVar5 = (double)std::allocator<char>::~allocator((allocator<char> *)&local_41);
  iVar2 = units::isinf(dVar5);
  local_69 = SUB41(iVar2,0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_68,&local_69,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ucs,(internal *)local_68,(AssertionResult *)"isinf(u1)","false","true",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x2d9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&ucs);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c8,"2.76e309m",
             (allocator *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar3 = units::getDefaultFlags();
  local_a8 = units::unit_cast_from_string(&local_c8,uVar3);
  std::__cxx11::string::~string((string *)&local_c8);
  dVar5 = (double)std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)&gtest_ar__1.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             + 7));
  iVar2 = units::isinf(dVar5);
  local_e1 = SUB41(iVar2,0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e0,&local_e1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)local_e0,(AssertionResult *)"isinf(ucs)","false","true",in_R9)
    ;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x2db,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  return;
}

Assistant:

TEST(stringToUnits, outOfRangeNumbers)
{
    auto u1 = unit_from_string("2.76e309m");
    EXPECT_TRUE(isinf(u1));
    auto ucs = unit_cast_from_string("2.76e309m");
    EXPECT_TRUE(isinf(ucs));
}